

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O1

sc_uint_subref * __thiscall sc_dt::sc_uint_subref::operator=(sc_uint_subref *this,sc_bv_base *a)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  sc_uint_base *psVar4;
  int iVar5;
  ulong uVar6;
  sc_uint_base aa;
  sc_uint_base local_38;
  
  iVar2 = (this->super_sc_uint_subref_r).m_left;
  iVar3 = (this->super_sc_uint_subref_r).m_right;
  iVar5 = iVar2 - iVar3;
  local_38.m_len = iVar5 + 1;
  local_38.super_sc_value_base._vptr_sc_value_base = (_func_int **)&PTR_concat_clear_data_0026e378;
  local_38.m_val = 0;
  local_38.m_ulen = 0x3f - iVar5;
  if (0xffffffbf < iVar5 - 0x40U) {
    sc_uint_base::operator=(&local_38,a);
    psVar4 = (this->super_sc_uint_subref_r).m_obj_p;
    uVar6 = local_38.m_val << ((byte)iVar3 & 0x3f);
    bVar1 = (byte)psVar4->m_ulen;
    psVar4->m_val =
         (((psVar4->m_val ^ uVar6) & *(ulong *)(mask_int + (long)iVar3 * 8 + (long)iVar2 * 0x200) ^
          uVar6) << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
    return this;
  }
  sc_uint_base::invalid_length(&local_38);
}

Assistant:

void
sc_uint_base::invalid_index( int i ) const
{
    std::stringstream msg;
    msg << "sc_uint[_base] bit selection: index = " << i
        << " violates 0 <= index <= " << (m_len - 1);
    SC_REPORT_ERROR( sc_core::SC_ID_OUT_OF_BOUNDS_, msg.str().c_str() );
    sc_core::sc_abort(); // can't recover from here
}